

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Integer ma_nelem(Pointer address,ulongi length,Integer datatype)

{
  bool bVar1;
  ulong uVar2;
  ulongi nbytes;
  Pointer client_space;
  ulong local_50;
  AR local_48;
  Pointer local_38;
  
  if (0x58 < length) {
    uVar2 = (length - 0x58) / (ulong)(long)ma_sizeof[datatype];
    if ((long)uVar2 < 1) {
      return uVar2;
    }
    local_48.datatype = datatype;
    do {
      local_48.nelem = uVar2;
      balloc_after(&local_48,address,&local_38,&local_50);
      if (local_50 <= length) {
        return uVar2;
      }
      bVar1 = 1 < (long)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

private Integer ma_nelem(address, length, datatype)
    Pointer    address;    /* location of hypothetical block */
    ulongi    length;        /* length of hypothetical block */
    Integer    datatype;    /* of elements in hypothetical block */
{
    AR        ar;        /* allocation request */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    if (length <= BLOCK_OVERHEAD_FIXED)
        /* no point in computing anything */
        return (Integer)0;

    /* compute initial request */
    ar.datatype = datatype;
    ar.nelem = (length - BLOCK_OVERHEAD_FIXED) / ma_sizeof[datatype];

    /* make requests until one succeeds or we give up */
    while (ar.nelem > 0)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, address, &client_space, &nbytes);

        if (nbytes > length)
            /* not enough space for ar.nelem elements */
            ar.nelem--;
        else
            /* enough space for ar.nelem elements */
            break;
    }

    /* return the result */
    return ar.nelem;
}